

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::emit_parser_prolog(X86Assembler *as)

{
  X86Assembler *as_local;
  
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159e80);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159eae);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159edc);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159f0a);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159f38);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159f66);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159f94);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as_local,(uint32_t)((ulong)as >> 0x20),(Operand_ *)0x159fc2);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0,(Operand_ *)(asmjit::x86OpData + 0x4c0),(Operand_ *)as);
  return;
}

Assistant:

static void emit_parser_prolog(asmjit::X86Assembler& as)
{
    as.push(asmjit::x86::r9);
    as.push(asmjit::x86::r8);
    as.push(asmjit::x86::rbp);
    as.push(asmjit::x86::rdi);
    as.push(asmjit::x86::rsi);
    as.push(asmjit::x86::rdx);
    as.push(asmjit::x86::rcx);
    as.push(asmjit::x86::rbx);

    //Save RSP for bailout
    as.mov(asmjit::x86::r9, asmjit::x86::rsp);
}